

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

bool __thiscall ON_Buffer::Compress(ON_Buffer *this,ON_Buffer *compressed_buffer)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ON__UINT32 OVar4;
  ON__UINT32 OVar5;
  ON_Buffer *this_00;
  ON__UINT64 OVar6;
  ON_BUFFER_SEGMENT *pOVar7;
  ulong uVar8;
  ON_BUFFER_SEGMENT *pOVar9;
  ON_CompressStream compressor;
  ON_CompressStream local_70;
  
  ON_CompressStream::ON_CompressStream(&local_70);
  this_00 = compressed_buffer;
  if (this == compressed_buffer) {
    this_00 = (ON_Buffer *)operator_new(0x40);
    ON_Buffer(this_00);
  }
  ChangeSize(this_00,0);
  uVar1 = this->m_buffer_size;
  if (((uVar1 == 0) ||
      (bVar3 = ON_CompressStream::SetCallback(&local_70,ON_Buffer_StreamCallback,this_00), !bVar3))
     || (bVar3 = ON_CompressStream::Begin(&local_70), !bVar3)) {
LAB_004603f6:
    bVar3 = false;
  }
  else {
    pOVar7 = this->m_first_segment;
    if (pOVar7 != (ON_BUFFER_SEGMENT *)0x0) {
      pOVar9 = (ON_BUFFER_SEGMENT *)0x0;
      do {
        uVar2 = pOVar7->m_segment_position0;
        uVar8 = pOVar7->m_segment_position1;
        if (uVar1 < pOVar7->m_segment_position1) {
          uVar8 = uVar1;
        }
        if ((uVar8 < uVar2) || (pOVar9 != pOVar7->m_prev_segment)) {
LAB_0046034d:
          bVar3 = false;
        }
        else {
          if (pOVar9 == (ON_BUFFER_SEGMENT *)0x0) {
            if (uVar2 != 0) {
              bVar3 = false;
              pOVar9 = (ON_BUFFER_SEGMENT *)0x0;
              goto LAB_0046034f;
            }
          }
          else if (pOVar9->m_segment_position1 != uVar2) goto LAB_0046034d;
          bVar3 = ON_CompressStream::In(&local_70,uVar8 - uVar2,pOVar7->m_segment_buffer);
          if (bVar3) {
            pOVar9 = pOVar7;
          }
        }
LAB_0046034f:
        if (bVar3 == false) goto LAB_004603f6;
        pOVar7 = pOVar7->m_next_segment;
      } while (pOVar7 != (ON_BUFFER_SEGMENT *)0x0);
    }
    bVar3 = ON_CompressStream::End(&local_70);
    if ((!bVar3) || (OVar6 = ON_CompressStream::InSize(&local_70), OVar6 != uVar1))
    goto LAB_004603f6;
    OVar4 = ON_CompressStream::InCRC(&local_70);
    OVar5 = CRC32(this,0);
    if ((OVar4 != OVar5) ||
       (OVar6 = ON_CompressStream::OutSize(&local_70), OVar6 != this_00->m_buffer_size))
    goto LAB_004603f6;
    OVar4 = ON_CompressStream::OutCRC(&local_70);
    OVar5 = CRC32(this_00,0);
    bVar3 = OVar4 == OVar5;
  }
  if (bVar3 == false) {
    ChangeSize(this_00,0);
    if (this != compressed_buffer) goto LAB_00460489;
  }
  else {
    Compact(this_00);
    this_00->m_current_position = 0;
    this_00->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    if (this != compressed_buffer) goto LAB_00460489;
    ChangeSize(compressed_buffer,0);
    compressed_buffer->m_buffer_size = this_00->m_buffer_size;
    compressed_buffer->m_current_position = this_00->m_current_position;
    compressed_buffer->m_first_segment = this_00->m_first_segment;
    compressed_buffer->m_last_segment = this_00->m_last_segment;
    compressed_buffer->m_current_segment = this_00->m_current_segment;
    compressed_buffer->m_error_handler = this_00->m_error_handler;
    compressed_buffer->m_last_error = this_00->m_last_error;
    this_00->m_buffer_size = 0;
    this_00->m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
    this_00->m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
    this_00->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
  }
  ~ON_Buffer(this_00);
  operator_delete(this_00,0x40);
LAB_00460489:
  ON_CompressStream::~ON_CompressStream(&local_70);
  return bVar3;
}

Assistant:

bool ON_Buffer::Compress( ON_Buffer& compressed_buffer ) const
{
  bool rc = false;
  ON_CompressStream compressor;
  ON_Buffer* out = ( this == &compressed_buffer ) ? new ON_Buffer() : &compressed_buffer;

  out->Destroy();

  for (;;)
  {
    ON__UINT64 uncompressed_size = Size();
    if ( uncompressed_size <= 0 )
      break;
    if ( !compressor.SetCallback(ON_Buffer_StreamCallback,out) )
      break;
    if ( !compressor.Begin() )
      break;

    struct ON_BUFFER_SEGMENT* prev_seg = 0;
    struct ON_BUFFER_SEGMENT* seg = 0;
    for ( seg = m_first_segment; 0 != seg; seg = seg->m_next_segment )
    {
      const ON__UINT64 pos1 = (uncompressed_size < seg->m_segment_position1)
                            ? uncompressed_size 
                            : seg->m_segment_position1;
      if ( pos1 < seg->m_segment_position0 )
        break;
      if ( prev_seg != seg->m_prev_segment )
        break;
      if ( 0 == prev_seg )
      {
        if ( 0 != seg->m_segment_position0 )
          break;
      }
      else
      {
        if ( prev_seg->m_segment_position1 != seg->m_segment_position0 )
          break;
      }
      if ( !compressor.In(pos1 - seg->m_segment_position0,seg->m_segment_buffer) )
        break;
      prev_seg = seg;
    }
    if ( 0 != seg )
      break;

    if ( !compressor.End() )
      break;

    if ( compressor.InSize() != uncompressed_size )
      break;
    if ( compressor.InCRC() != CRC32(0) )
      break;
    if ( compressor.OutSize() != out->Size() )
      break;
    if ( compressor.OutCRC() != out->CRC32(0) )
      break;

    rc = true;
    break;
  }

  if ( !rc )
  {
    out->Destroy();
    if ( this == &compressed_buffer )
      delete out;
  }
  else
  {
    out->Compact();
    out->m_current_position = 0;
    out->m_current_segment = 0;
    if ( this == &compressed_buffer )
    {
      // transfer "out" to "this"
      compressed_buffer.Destroy();
      compressed_buffer.m_buffer_size = out->m_buffer_size;
      compressed_buffer.m_current_position = out->m_current_position;
      compressed_buffer.m_first_segment = out->m_first_segment;
      compressed_buffer.m_last_segment = out->m_last_segment;
      compressed_buffer.m_current_segment = out->m_current_segment;
      compressed_buffer.m_error_handler = out->m_error_handler;
      compressed_buffer.m_last_error = out->m_last_error;
      
      out->m_first_segment = 0;
      out->m_last_segment = 0;
      out->m_current_segment = 0;
      out->m_buffer_size = 0;
      delete out;
    }
  }

  return rc;
}